

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

common_init_result *
common_init_from_params(common_init_result *__return_storage_ptr__,common_params *params)

{
  pointer pcVar1;
  undefined8 *puVar2;
  common_params_sampling *pcVar3;
  common_params *pcVar4;
  undefined1 auVar5 [8];
  char cVar6;
  int iVar7;
  int32_t iVar8;
  int iVar9;
  uint uVar10;
  pointer __p;
  undefined8 uVar11;
  common_log *pcVar12;
  llama_logit_bias lVar13;
  llama_vocab *vocab;
  long lVar14;
  ulong uVar15;
  llama_model_params *plVar16;
  llama_context_params *plVar17;
  undefined8 *puVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  byte bVar22;
  common_control_vector_data cvec;
  llama_token decoder_start_token_id;
  llama_token bos;
  llama_token eos;
  llama_model_params mparams;
  llama_context_params cparams;
  undefined4 local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined8 local_208;
  llama_context *local_1b8;
  common_params *local_1b0;
  undefined1 local_1a8 [8];
  llama_logit_bias lStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  common_init_result *local_188;
  int local_17c;
  int local_178;
  int local_174;
  undefined8 local_170;
  vector<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>,std::allocator<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>>>
  *local_168;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined8 local_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined8 local_f8;
  llama_model_params local_f0;
  llama_context_params local_a8;
  
  bVar22 = 0;
  (__return_storage_ptr__->lora).
  super__Vector_base<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->lora).
  super__Vector_base<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->model)._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
  super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
  super__Head_base<0UL,_llama_model_*,_false>._M_head_impl = (llama_model *)0x0;
  (__return_storage_ptr__->context)._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>
  ._M_t.super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
  super__Head_base<0UL,_llama_context_*,_false>._M_head_impl = (llama_context *)0x0;
  (__return_storage_ptr__->lora).
  super__Vector_base<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  common_model_params_to_llama(&local_f0,params);
  pcVar1 = (params->model).path._M_dataplus._M_p;
  plVar16 = &local_f0;
  puVar18 = (undefined8 *)&local_238;
  for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar18 = plVar16->devices;
    plVar16 = (llama_model_params *)((long)plVar16 + ((ulong)bVar22 * -2 + 1) * 8);
    puVar18 = puVar18 + (ulong)bVar22 * -2 + 1;
  }
  __p = (pointer)llama_model_load_from_file(pcVar1);
  if (__p == (pointer)0x0) {
    if (common_log_verbosity_thold < 0) {
      return __return_storage_ptr__;
    }
    pcVar12 = common_log_main();
    common_log_add(pcVar12,GGML_LOG_LEVEL_ERROR,"%s: failed to load model \'%s\'\n",
                   "common_init_from_params",(params->model).path._M_dataplus._M_p);
    return __return_storage_ptr__;
  }
  uVar11 = llama_model_get_vocab(__p);
  if (params->reranking == true) {
    iVar7 = llama_vocab_bos(uVar11);
    bVar19 = iVar7 != -1;
    if ((!bVar19) && (-1 < common_log_verbosity_thold)) {
      pcVar12 = common_log_main();
      common_log_add(pcVar12,GGML_LOG_LEVEL_WARN,
                     "%s: warning: vocab does not have a  BOS token, reranking will not work\n",
                     "common_init_from_params");
    }
    iVar7 = llama_vocab_eos(uVar11);
    if (iVar7 == -1) {
      if (common_log_verbosity_thold < 0) {
        bVar19 = false;
      }
      else {
        pcVar12 = common_log_main();
        bVar19 = false;
        common_log_add(pcVar12,GGML_LOG_LEVEL_WARN,
                       "%s: warning: vocab does not have an EOS token, reranking will not work\n",
                       "common_init_from_params");
      }
    }
    iVar7 = llama_vocab_sep(uVar11);
    if (iVar7 == -1) {
      if (common_log_verbosity_thold < 0) {
        bVar19 = false;
      }
      else {
        pcVar12 = common_log_main();
        bVar19 = false;
        common_log_add(pcVar12,GGML_LOG_LEVEL_WARN,
                       "%s: warning: vocab does not have a  SEP token, reranking will not work\n",
                       "common_init_from_params");
      }
    }
    if (!bVar19) {
      llama_model_free(__p);
    }
    bVar19 = (bool)(bVar19 ^ 1);
    if (bVar19) goto LAB_001394ce;
  }
  else {
    bVar19 = false;
  }
  local_1b0 = params;
  common_context_params_to_llama(&local_a8,params);
  plVar17 = &local_a8;
  puVar18 = (undefined8 *)&local_238;
  for (lVar14 = 0xf; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar18 = *(undefined8 *)plVar17;
    plVar17 = (llama_context_params *)((long)plVar17 + ((ulong)bVar22 * -2 + 1) * 8);
    puVar18 = puVar18 + (ulong)bVar22 * -2 + 1;
  }
  local_1b8 = (llama_context *)llama_init_from_model(__p);
  if (local_1b8 == (llama_context *)0x0) {
    if (-1 < common_log_verbosity_thold) {
      pcVar12 = common_log_main();
      common_log_add(pcVar12,GGML_LOG_LEVEL_ERROR,"%s: failed to create context with model \'%s\'\n"
                     ,"common_init_from_params",(local_1b0->model).path._M_dataplus._M_p);
    }
    bVar19 = true;
    llama_model_free(__p);
    goto LAB_001394ce;
  }
  if ((local_1b0->ctx_shift == true) && (cVar6 = llama_kv_self_can_shift(local_1b8), cVar6 == '\0'))
  {
    if (-1 < common_log_verbosity_thold) {
      pcVar12 = common_log_main();
      common_log_add(pcVar12,GGML_LOG_LEVEL_WARN,
                     "%s: KV cache shifting is not supported for this context, disabling KV cache shifting\n"
                     ,"common_init_from_params");
    }
    local_1b0->ctx_shift = false;
  }
  if (*(long *)&local_1b0->control_vectors != *(long *)&local_1b0->field_0xfc8) {
    if (local_1b0->control_vector_layer_start < 1) {
      local_1b0->control_vector_layer_start = 1;
    }
    if (local_1b0->control_vector_layer_end < 1) {
      iVar8 = llama_model_n_layer(__p);
      local_1b0->control_vector_layer_end = iVar8;
    }
    pcVar4 = local_1b0;
    common_control_vector_load((common_control_vector_data *)local_1a8,&local_1b0->control_vectors);
    if (local_1a8._0_4_ == -1) {
      llama_free(local_1b8);
      llama_model_free(__p);
LAB_00138dc1:
      bVar19 = true;
      bVar20 = false;
    }
    else {
      iVar7 = llama_apply_adapter_cvec
                        (local_1b8,lStack_1a0,
                         (long)(local_198._M_allocated_capacity - (long)lStack_1a0) >> 2,
                         (ulong)local_1a8 & 0xffffffff,pcVar4->control_vector_layer_start,
                         pcVar4->control_vector_layer_end);
      bVar20 = iVar7 == 0;
      if (!bVar20) {
        llama_free(local_1b8);
        llama_model_free(__p);
        goto LAB_00138dc1;
      }
    }
    if (lStack_1a0 != (llama_logit_bias)0x0) {
      operator_delete((void *)lStack_1a0,local_198._8_8_ - (long)lStack_1a0);
    }
    if (!bVar20) goto LAB_001394ce;
  }
  puVar18 = *(undefined8 **)&local_1b0->lora_adapters;
  puVar2 = *(undefined8 **)&local_1b0->field_0xfb0;
  bVar20 = puVar18 == puVar2;
  local_188 = __return_storage_ptr__;
  local_170 = uVar11;
  if (!bVar20) {
    local_168 = (vector<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>,std::allocator<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>>>
                 *)&__return_storage_ptr__->lora;
    do {
      local_1a8._0_4_ = 0;
      local_1a8._4_4_ = 0.0;
      lVar13 = (llama_logit_bias)llama_adapter_lora_init(__p,*puVar18);
      bVar21 = (llama_logit_bias)local_1a8 != (llama_logit_bias)0x0;
      local_1a8 = (undefined1  [8])lVar13;
      if (bVar21) {
        llama_adapter_lora_free();
      }
      auVar5 = local_1a8;
      if ((llama_logit_bias)local_1a8 == (llama_logit_bias)0x0) {
        if (-1 < common_log_verbosity_thold) {
          pcVar12 = common_log_main();
          common_log_add(pcVar12,GGML_LOG_LEVEL_ERROR,"%s: failed to apply lora adapter \'%s\'\n",
                         "common_init_from_params",*puVar18);
        }
        llama_free(local_1b8);
        bVar19 = true;
        llama_model_free(__p);
      }
      else {
        ((llama_logit_bias *)(puVar18 + 5))->token = local_1a8._0_4_;
        ((llama_logit_bias *)(puVar18 + 5))->bias = (float)local_1a8._4_4_;
        std::
        vector<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>,std::allocator<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>>>
        ::emplace_back<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>>
                  (local_168,(unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter> *)local_1a8
                  );
      }
      std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>::~unique_ptr
                ((unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter> *)local_1a8);
      if ((llama_logit_bias)auVar5 == (llama_logit_bias)0x0) break;
      puVar18 = puVar18 + 6;
      bVar20 = puVar18 == puVar2;
    } while (!bVar20);
  }
  uVar11 = local_170;
  __return_storage_ptr__ = local_188;
  if (bVar20) {
    if (local_1b0->lora_init_without_apply == false) {
      common_set_adapter_lora(local_1b8,&local_1b0->lora_adapters);
    }
    if (((local_1b0->sampling).ignore_eos == true) && (iVar7 = llama_vocab_eos(uVar11), iVar7 == -1)
       ) {
      if (-1 < common_log_verbosity_thold) {
        pcVar12 = common_log_main();
        common_log_add(pcVar12,GGML_LOG_LEVEL_WARN,
                       "%s: warning: vocab does not have an EOS token, ignoring --ignore-eos\n",
                       "common_init_from_params");
      }
      (local_1b0->sampling).ignore_eos = false;
    }
    if ((local_1b0->sampling).ignore_eos == true) {
      pcVar3 = &local_1b0->sampling;
      for (iVar7 = 0; iVar9 = llama_vocab_n_tokens(local_170), iVar7 < iVar9; iVar7 = iVar7 + 1) {
        cVar6 = llama_vocab_is_eog(local_170,iVar7);
        if (cVar6 != '\0') {
          if (-1 < common_log_verbosity_thold) {
            pcVar12 = common_log_main();
            uVar11 = llama_get_model(local_1b8);
            vocab = (llama_vocab *)llama_model_get_vocab(uVar11);
            common_token_to_piece_abi_cxx11_((string *)local_1a8,vocab,iVar7,true);
            common_log_add(pcVar12,GGML_LOG_LEVEL_INFO,"%s: added %s logit bias = %f\n",0,
                           "common_init_from_params",local_1a8);
            if (local_1a8 != (undefined1  [8])&local_198) {
              operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
            }
          }
          local_1a8._4_4_ = -INFINITY;
          local_1a8._0_4_ = iVar7;
          std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::
          emplace_back<llama_logit_bias>(&pcVar3->logit_bias,(llama_logit_bias *)local_1a8);
        }
      }
    }
    uVar11 = local_170;
    if ((local_1b0->sampling).penalty_last_n == -1) {
      if (-1 < common_log_verbosity_thold) {
        pcVar12 = common_log_main();
        uVar10 = llama_n_ctx(local_1b8);
        common_log_add(pcVar12,GGML_LOG_LEVEL_INFO,"%s: setting penalty_last_n to ctx_size = %d\n",
                       "common_init_from_params",(ulong)uVar10);
      }
      iVar8 = llama_n_ctx(local_1b8);
      (local_1b0->sampling).penalty_last_n = iVar8;
    }
    if ((local_1b0->sampling).dry_penalty_last_n == -1) {
      if (-1 < common_log_verbosity_thold) {
        pcVar12 = common_log_main();
        uVar10 = llama_n_ctx(local_1b8);
        common_log_add(pcVar12,GGML_LOG_LEVEL_INFO,
                       "%s: setting dry_penalty_last_n to ctx_size = %d\n","common_init_from_params"
                       ,(ulong)uVar10);
      }
      iVar8 = llama_n_ctx(local_1b8);
      (local_1b0->sampling).dry_penalty_last_n = iVar8;
    }
    if (local_1b0->warmup == true) {
      if (-1 < common_log_verbosity_thold) {
        pcVar12 = common_log_main();
        common_log_add(pcVar12,GGML_LOG_LEVEL_WARN,
                       "%s: warming up the model with an empty run - please wait ... (--no-warmup to disable)\n"
                       ,"common_init_from_params");
      }
      llama_set_warmup(local_1b8,1);
      local_1a8._0_4_ = 0;
      local_1a8._4_4_ = 0.0;
      lStack_1a0.token = 0;
      lStack_1a0.bias = 0.0;
      local_198._M_allocated_capacity = 0;
      local_178 = llama_vocab_bos(uVar11);
      local_174 = llama_vocab_eos(uVar11);
      if (local_178 != -1) {
        if (lStack_1a0 == (llama_logit_bias)local_198._M_allocated_capacity) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)local_1a8,(iterator)lStack_1a0,&local_178);
        }
        else {
          *(int *)lStack_1a0 = local_178;
          lStack_1a0 = (llama_logit_bias)((long)lStack_1a0 + 4);
        }
      }
      if (local_174 != -1) {
        if (lStack_1a0 == (llama_logit_bias)local_198._M_allocated_capacity) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)local_1a8,(iterator)lStack_1a0,&local_174);
        }
        else {
          *(int *)lStack_1a0 = local_174;
          lStack_1a0 = (llama_logit_bias)((long)lStack_1a0 + 4);
        }
      }
      if ((llama_logit_bias)local_1a8 == lStack_1a0) {
        local_17c = 0;
        if (lStack_1a0 == (llama_logit_bias)local_198._M_allocated_capacity) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_1a8,(iterator)lStack_1a0,&local_17c)
          ;
        }
        else {
          *(int *)lStack_1a0 = 0;
          lStack_1a0 = (llama_logit_bias)((long)lStack_1a0 + 4);
        }
      }
      cVar6 = llama_model_has_encoder(__p);
      if (cVar6 != '\0') {
        llama_batch_get_one(&local_128,local_1a8,(ulong)((long)lStack_1a0 - (long)local_1a8) >> 2);
        local_208 = local_f8;
        local_218 = local_108;
        uStack_214 = uStack_104;
        uStack_210 = uStack_100;
        uStack_20c = uStack_fc;
        local_228 = local_118;
        uStack_224 = uStack_114;
        uStack_220 = uStack_110;
        uStack_21c = uStack_10c;
        local_238 = local_128;
        uStack_234 = uStack_124;
        uStack_230 = uStack_120;
        uStack_22c = uStack_11c;
        llama_encode(local_1b8);
        local_17c = llama_model_decoder_start_token(__p);
        if (local_17c == -1) {
          local_17c = local_178;
        }
        if (lStack_1a0 != (llama_logit_bias)local_1a8) {
          lStack_1a0.token = local_1a8._0_4_;
          lStack_1a0.bias = (float)local_1a8._4_4_;
        }
        if (lStack_1a0 == (llama_logit_bias)local_198._M_allocated_capacity) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)local_1a8,(iterator)lStack_1a0,&local_17c);
        }
        else {
          *(int *)lStack_1a0 = local_17c;
          lStack_1a0 = (llama_logit_bias)((long)lStack_1a0 + 4);
        }
      }
      cVar6 = llama_model_has_decoder(__p);
      if (cVar6 != '\0') {
        uVar15 = (long)lStack_1a0 - (long)local_1a8 >> 2;
        if ((ulong)(long)local_1b0->n_batch <= uVar15) {
          uVar15 = (long)local_1b0->n_batch;
        }
        llama_batch_get_one(&local_160,local_1a8,uVar15);
        local_208 = local_130;
        local_218 = local_140;
        uStack_214 = uStack_13c;
        uStack_210 = uStack_138;
        uStack_20c = uStack_134;
        local_228 = local_150;
        uStack_224 = uStack_14c;
        uStack_220 = uStack_148;
        uStack_21c = uStack_144;
        local_238 = local_160;
        uStack_234 = uStack_15c;
        uStack_230 = uStack_158;
        uStack_22c = uStack_154;
        llama_decode(local_1b8);
      }
      llama_kv_self_clear(local_1b8);
      llama_synchronize(local_1b8);
      llama_perf_context_reset(local_1b8);
      llama_set_warmup(local_1b8,0);
      if ((llama_logit_bias)local_1a8 != (llama_logit_bias)0x0) {
        operator_delete((void *)local_1a8,local_198._M_allocated_capacity - (long)local_1a8);
      }
    }
    std::__uniq_ptr_impl<llama_model,_llama_model_deleter>::reset
              ((__uniq_ptr_impl<llama_model,_llama_model_deleter> *)__return_storage_ptr__,__p);
    std::__uniq_ptr_impl<llama_context,_llama_context_deleter>::reset
              ((__uniq_ptr_impl<llama_context,_llama_context_deleter> *)
               &__return_storage_ptr__->context,local_1b8);
    bVar19 = true;
  }
LAB_001394ce:
  if (!bVar19) {
    std::
    vector<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
    ::~vector(&__return_storage_ptr__->lora);
    std::unique_ptr<llama_context,_llama_context_deleter>::~unique_ptr
              (&__return_storage_ptr__->context);
    std::unique_ptr<llama_model,_llama_model_deleter>::~unique_ptr(&__return_storage_ptr__->model);
  }
  return __return_storage_ptr__;
}

Assistant:

struct common_init_result common_init_from_params(common_params & params) {
    common_init_result iparams;
    auto mparams = common_model_params_to_llama(params);

    llama_model * model = llama_model_load_from_file(params.model.path.c_str(), mparams);
    if (model == NULL) {
        LOG_ERR("%s: failed to load model '%s'\n", __func__, params.model.path.c_str());
        return iparams;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    if (params.reranking) {
        bool ok = true;

        if (llama_vocab_bos(vocab) == LLAMA_TOKEN_NULL) {
            LOG_WRN("%s: warning: vocab does not have a  BOS token, reranking will not work\n", __func__);
            ok = false;
        }

        if (llama_vocab_eos(vocab) == LLAMA_TOKEN_NULL) {
            LOG_WRN("%s: warning: vocab does not have an EOS token, reranking will not work\n", __func__);
            ok = false;
        }

        if (llama_vocab_sep(vocab) == LLAMA_TOKEN_NULL) {
            LOG_WRN("%s: warning: vocab does not have a  SEP token, reranking will not work\n", __func__);
            ok = false;
        }

        if (!ok) {
            llama_model_free(model);

            return iparams;
        }
    }

    auto cparams = common_context_params_to_llama(params);

    llama_context * lctx = llama_init_from_model(model, cparams);
    if (lctx == NULL) {
        LOG_ERR("%s: failed to create context with model '%s'\n", __func__, params.model.path.c_str());
        llama_model_free(model);
        return iparams;
    }

    if (params.ctx_shift && !llama_kv_self_can_shift(lctx)) {
        LOG_WRN("%s: KV cache shifting is not supported for this context, disabling KV cache shifting\n", __func__);
        params.ctx_shift = false;
    }

    if (!params.control_vectors.empty()) {
        if (params.control_vector_layer_start <= 0) params.control_vector_layer_start = 1;
        if (params.control_vector_layer_end   <= 0) params.control_vector_layer_end   = llama_model_n_layer(model);

        const auto cvec = common_control_vector_load(params.control_vectors);
        if (cvec.n_embd == -1) {
            llama_free(lctx);
            llama_model_free(model);

            return iparams;
        }

        int err = llama_apply_adapter_cvec(
                lctx,
                cvec.data.data(),
                cvec.data.size(),
                cvec.n_embd,
                params.control_vector_layer_start,
                params.control_vector_layer_end);
        if (err) {
            llama_free(lctx);
            llama_model_free(model);

            return iparams;
        }
    }

    // load and optionally apply lora adapters
    for (auto & la : params.lora_adapters) {
        llama_adapter_lora_ptr lora;
        lora.reset(llama_adapter_lora_init(model, la.path.c_str()));
        if (lora == nullptr) {
            LOG_ERR("%s: failed to apply lora adapter '%s'\n", __func__, la.path.c_str());
            llama_free(lctx);
            llama_model_free(model);
            return iparams;
        }

        la.ptr = lora.get();
        iparams.lora.emplace_back(std::move(lora)); // copy to list of loaded adapters
    }

    if (!params.lora_init_without_apply) {
        common_set_adapter_lora(lctx, params.lora_adapters);
    }

    if (params.sampling.ignore_eos && llama_vocab_eos(vocab) == LLAMA_TOKEN_NULL) {
        LOG_WRN("%s: warning: vocab does not have an EOS token, ignoring --ignore-eos\n", __func__);
        params.sampling.ignore_eos = false;
    }

    if (params.sampling.ignore_eos) {
        for (llama_token i = 0; i < llama_vocab_n_tokens(vocab); i++) {
            if (llama_vocab_is_eog(vocab, i)) {
                LOG_INF("%s: added %s logit bias = %f\n", __func__, common_token_to_piece(lctx, i).c_str(), -INFINITY);
                params.sampling.logit_bias.push_back({i, -INFINITY});
            }
        }
    }

    if (params.sampling.penalty_last_n == -1) {
        LOG_INF("%s: setting penalty_last_n to ctx_size = %d\n", __func__, llama_n_ctx(lctx));
        params.sampling.penalty_last_n = llama_n_ctx(lctx);
    }

    if (params.sampling.dry_penalty_last_n == -1) {
        LOG_INF("%s: setting dry_penalty_last_n to ctx_size = %d\n", __func__, llama_n_ctx(lctx));
        params.sampling.dry_penalty_last_n = llama_n_ctx(lctx);
    }

    if (params.warmup) {
        LOG_WRN("%s: warming up the model with an empty run - please wait ... (--no-warmup to disable)\n", __func__);

        llama_set_warmup(lctx, true);

        std::vector<llama_token> tmp;
        llama_token bos = llama_vocab_bos(vocab);
        llama_token eos = llama_vocab_eos(vocab);

        // some models (e.g. T5) don't have a BOS token
        if (bos != LLAMA_TOKEN_NULL) {
            tmp.push_back(bos);
        }
        if (eos != LLAMA_TOKEN_NULL) {
            tmp.push_back(eos);
        }
        if (tmp.empty()) {
            tmp.push_back(0);
        }

        if (llama_model_has_encoder(model)) {
            llama_encode(lctx, llama_batch_get_one(tmp.data(), tmp.size()));
            llama_token decoder_start_token_id = llama_model_decoder_start_token(model);
            if (decoder_start_token_id == LLAMA_TOKEN_NULL) {
                decoder_start_token_id = bos;
            }
            tmp.clear();
            tmp.push_back(decoder_start_token_id);
        }
        if (llama_model_has_decoder(model)) {
            llama_decode(lctx, llama_batch_get_one(tmp.data(), std::min(tmp.size(), (size_t) params.n_batch)));
        }
        llama_kv_self_clear(lctx);
        llama_synchronize(lctx);
        llama_perf_context_reset(lctx);
        llama_set_warmup(lctx, false);
    }

    iparams.model.reset(model);
    iparams.context.reset(lctx);

    return iparams;
}